

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O3

float Scl_LibLookup(SC_Surface *p,float slew,float load)

{
  long lVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  float *pfVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  
  iVar3 = (p->vIndex0).nSize;
  if (iVar3 == 1) {
    if ((p->vIndex1).nSize == 1) {
      iVar3 = (p->vData).nSize;
      if (0 < iVar3) {
        if (iVar3 != 1) {
          __assert_fail("Vec_PtrSize(&p->vData) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                        ,0x1e9,"float Scl_LibLookup(SC_Surface *, float, float)");
        }
        pvVar4 = *(p->vData).pArray;
        if (*(int *)((long)pvVar4 + 4) == 1) {
          return **(float **)((long)pvVar4 + 8);
        }
        __assert_fail("Vec_FltSize(vTemp) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLib.h"
                      ,0x1ea,"float Scl_LibLookup(SC_Surface *, float, float)");
      }
      goto LAB_00474284;
    }
    pfVar10 = (p->vIndex0).pArray;
    uVar12 = 1;
  }
  else {
    pfVar10 = (p->vIndex0).pArray;
    uVar12 = 1;
    if (2 < iVar3) {
      uVar12 = 1;
      do {
        if (slew < pfVar10[uVar12]) goto LAB_004741aa;
        uVar12 = uVar12 + 1;
      } while (iVar3 - 1U != uVar12);
      uVar12 = (ulong)(iVar3 - 1U);
    }
  }
LAB_004741aa:
  pfVar5 = (p->vIndex1).pArray;
  iVar3 = (p->vIndex1).nSize;
  uVar13 = 1;
  if (2 < iVar3) {
    uVar14 = iVar3 - 1;
    uVar13 = 1;
    do {
      if (load < pfVar5[uVar13]) goto LAB_004741dd;
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
    uVar13 = (ulong)uVar14;
  }
LAB_004741dd:
  iVar9 = (int)uVar12;
  lVar1 = (long)(int)uVar13 + -1;
  iVar3 = (p->vData).nSize;
  if ((iVar9 <= iVar3) && (iVar9 < iVar3)) {
    uVar11 = uVar13 & 0xffffffff;
    fVar15 = (load - pfVar5[(long)(int)uVar13 + -1]) /
             (pfVar5[uVar11] - pfVar5[(long)(int)uVar13 + -1]);
    ppvVar6 = (p->vData).pArray;
    lVar7 = *(long *)((long)ppvVar6[iVar9 - 1U] + 8);
    lVar8 = *(long *)((long)ppvVar6[uVar12 & 0xffffffff] + 8);
    fVar2 = *(float *)(lVar8 + lVar1 * 4);
    fVar16 = *(float *)(lVar7 + lVar1 * 4);
    fVar16 = fVar15 * (*(float *)(lVar7 + uVar11 * 4) - fVar16) + fVar16;
    return ((fVar15 * (*(float *)(lVar8 + uVar11 * 4) - fVar2) + fVar2) - fVar16) *
           ((slew - pfVar10[(int)(iVar9 - 1U)]) /
           (pfVar10[uVar12 & 0xffffffff] - pfVar10[(int)(iVar9 - 1U)])) + fVar16;
  }
LAB_00474284:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline float Scl_LibLookup( SC_Surface * p, float slew, float load )
{
    float * pIndex0, * pIndex1, * pDataS, * pDataS1;
    float sfrac, lfrac, p0, p1;
    int s, l;

    // handle constant table
    if ( Vec_FltSize(&p->vIndex0) == 1 && Vec_FltSize(&p->vIndex1) == 1 )
    {
        Vec_Flt_t * vTemp = (Vec_Flt_t *)Vec_PtrEntry(&p->vData, 0);
        assert( Vec_PtrSize(&p->vData) == 1 );
        assert( Vec_FltSize(vTemp) == 1 );
        return Vec_FltEntry(vTemp, 0);
    }

    // Find closest sample points in surface:
    pIndex0 = Vec_FltArray(&p->vIndex0);
    for ( s = 1; s < Vec_FltSize(&p->vIndex0)-1; s++ )
        if ( pIndex0[s] > slew )
            break;
    s--;

    pIndex1 = Vec_FltArray(&p->vIndex1);
    for ( l = 1; l < Vec_FltSize(&p->vIndex1)-1; l++ )
        if ( pIndex1[l] > load )
            break;
    l--;

    // Interpolate (or extrapolate) function value from sample points:
    sfrac = (slew - pIndex0[s]) / (pIndex0[s+1] - pIndex0[s]);
    lfrac = (load - pIndex1[l]) / (pIndex1[l+1] - pIndex1[l]);

    pDataS  = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s) );
    pDataS1 = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s+1) );

    p0 = pDataS [l] + lfrac * (pDataS [l+1] - pDataS [l]);
    p1 = pDataS1[l] + lfrac * (pDataS1[l+1] - pDataS1[l]);

    return p0 + sfrac * (p1 - p0);      // <<== multiply result with K factor here 
}